

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall
TApp_IniFlagConvertFailure_Test::TApp_IniFlagConvertFailure_Test
          (TApp_IniFlagConvertFailure_Test *this)

{
  TApp_IniFlagConvertFailure_Test *this_local;
  
  TApp::TApp(&this->super_TApp);
  (this->super_TApp).super_Test._vptr_Test =
       (_func_int **)&PTR__TApp_IniFlagConvertFailure_Test_001c6d80;
  return;
}

Assistant:

TEST_F(TApp, IniFlagConvertFailure) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.add_flag("--flag");
    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "flag=moobook" << std::endl;
    }

    EXPECT_THROW(run(), CLI::ConversionError);
}